

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR moveto_scnode(lyxp_set *set,lys_module *moveto_mod,char *ncname,lyxp_axis axis,
                    uint32_t options)

{
  ly_ctx *ctx;
  lysc_node *sparent;
  char *name;
  LY_ERR LVar1;
  char *pcVar2;
  size_t prefix_len;
  size_t name_len;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyxp_node_type iter_type;
  lysc_node *iter;
  lys_module *mod;
  uint32_t idx;
  uint32_t mod_idx;
  uint32_t i;
  uint32_t orig_used;
  uint32_t getnext_opts;
  lyxp_axis lStack_2c;
  ly_bool temp_ctx;
  uint32_t options_local;
  lyxp_axis axis_local;
  char *ncname_local;
  lys_module *moveto_mod_local;
  lyxp_set *set_local;
  
  orig_used._3_1_ = '\0';
  iter = (lysc_node *)0x0;
  if ((options & 0x20) == 0) {
    getnext_opts = options;
    lStack_2c = axis;
    _options_local = ncname;
    ncname_local = (char *)moveto_mod;
    moveto_mod_local = (lys_module *)set;
    if (set->type == LYXP_SET_SCNODE_SET) {
      i = 0;
      if ((options & 0x10) != 0) {
        i = 0x10;
      }
      if ((options & 0x200) != 0) {
        i = i | 0x20;
      }
      mod_idx = set->used;
      for (idx = 0; idx < mod_idx; idx = idx + 1) {
        LVar1 = moveto_axis_scnode_next_in_ctx
                          ((int32_t *)(moveto_mod_local->revision + (ulong)idx * 0x18 + 0xc),
                           lStack_2c);
        if (LVar1 == LY_SUCCESS) {
          _ret__ = (lysc_node *)0x0;
          ret___1 = LY_SUCCESS;
          while (LVar1 = moveto_axis_scnode_next
                                   ((lysc_node **)&ret__,&ret___1,(lys_module **)&iter,
                                    (uint32_t *)((long)&mod + 4),
                                    *(lysc_node **)(moveto_mod_local->revision + (ulong)idx * 0x18),
                                    *(lyxp_node_type *)
                                     (moveto_mod_local->revision + (ulong)idx * 0x18 + 8),lStack_2c,
                                    (lyxp_set *)moveto_mod_local,i), LVar1 == LY_SUCCESS) {
            LVar1 = moveto_scnode_check(_ret__,(lysc_node *)0x0,(lyxp_set *)moveto_mod_local,
                                        _options_local,(lys_module *)ncname_local);
            if (LVar1 == LY_SUCCESS) {
              LVar1 = lyxp_set_scnode_insert_node
                                ((lyxp_set *)moveto_mod_local,_ret__,ret___1,lStack_2c,
                                 (uint32_t *)&mod);
              if (LVar1 != LY_SUCCESS) {
                return LVar1;
              }
              if (((uint)mod < mod_idx) && (idx < (uint)mod)) {
                pcVar2 = moveto_mod_local->revision + (ulong)(uint)mod * 0x18 + 0xc;
                pcVar2[0] = '\x03';
                pcVar2[1] = '\0';
                pcVar2[2] = '\0';
                pcVar2[3] = '\0';
                orig_used._3_1_ = '\x01';
              }
            }
          }
          if ((((ncname_local != (char *)0x0) && (_options_local != (char *)0x0)) &&
              ((lStack_2c == LYXP_AXIS_DESCENDANT || (lStack_2c == LYXP_AXIS_CHILD)))) &&
             (*(int *)(moveto_mod_local->revision + (ulong)idx * 0x18 + 8) == 3)) {
            sparent = *(lysc_node **)(moveto_mod_local->revision + (ulong)idx * 0x18);
            pcVar2 = *(char **)(ncname_local + 8);
            prefix_len = strlen(*(char **)(ncname_local + 8));
            name = _options_local;
            name_len = strlen(_options_local);
            LVar1 = ly_nested_ext_schema
                              ((lyd_node *)0x0,sparent,pcVar2,prefix_len,LY_VALUE_JSON,(void *)0x0,
                               name,name_len,(lysc_node **)&ret__,(lysc_ext_instance **)0x0);
            if (LVar1 == LY_SUCCESS) {
              LVar1 = lyxp_set_scnode_insert_node
                                ((lyxp_set *)moveto_mod_local,_ret__,LYXP_NODE_ELEM,lStack_2c,
                                 (uint32_t *)&mod);
              if (LVar1 != LY_SUCCESS) {
                return LVar1;
              }
              if (((uint)mod < mod_idx) && (idx < (uint)mod)) {
                pcVar2 = moveto_mod_local->revision + (ulong)(uint)mod * 0x18 + 0xc;
                pcVar2[0] = '\x03';
                pcVar2[1] = '\0';
                pcVar2[2] = '\0';
                pcVar2[3] = '\0';
                orig_used._3_1_ = '\x01';
              }
            }
          }
        }
      }
      if (orig_used._3_1_ != '\0') {
        for (idx = 0; idx < mod_idx; idx = idx + 1) {
          if (*(int *)(moveto_mod_local->revision + (ulong)idx * 0x18 + 0xc) == 3) {
            pcVar2 = moveto_mod_local->revision + (ulong)idx * 0x18 + 0xc;
            pcVar2[0] = '\x02';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
          }
        }
      }
      set_local._4_4_ = LY_SUCCESS;
    }
    else {
      ctx = set->ctx;
      pcVar2 = print_set_type(set);
      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.","path operator",
              pcVar2);
      set_local._4_4_ = LY_EVALID;
    }
  }
  else {
    set_local._4_4_ = LY_SUCCESS;
  }
  return set_local._4_4_;
}

Assistant:

static LY_ERR
moveto_scnode(struct lyxp_set *set, const struct lys_module *moveto_mod, const char *ncname, enum lyxp_axis axis,
        uint32_t options)
{
    ly_bool temp_ctx = 0;
    uint32_t getnext_opts, orig_used, i, mod_idx, idx;
    const struct lys_module *mod = NULL;
    const struct lysc_node *iter;
    enum lyxp_node_type iter_type;

    if (options & LYXP_SKIP_EXPR) {
        return LY_SUCCESS;
    }

    if (set->type != LYXP_SET_SCNODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
        return LY_EVALID;
    }

    /* getnext opts */
    getnext_opts = 0;
    if (options & LYXP_SCNODE_OUTPUT) {
        getnext_opts |= LYS_GETNEXT_OUTPUT;
    }
    if (options & LYXP_SCNODE_SCHEMAMOUNT) {
        getnext_opts |= LYS_GETNEXT_WITHSCHEMAMOUNT;
    }

    orig_used = set->used;
    for (i = 0; i < orig_used; ++i) {
        /* update in_ctx first */
        if (moveto_axis_scnode_next_in_ctx(&set->val.scnodes[i].in_ctx, axis)) {
            /* not usable, skip */
            continue;
        }

        iter = NULL;
        iter_type = 0;
        while (!moveto_axis_scnode_next(&iter, &iter_type, &mod, &mod_idx, set->val.scnodes[i].scnode,
                set->val.scnodes[i].type, axis, set, getnext_opts)) {
            if (moveto_scnode_check(iter, NULL, set, ncname, moveto_mod)) {
                continue;
            }

            /* insert */
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, iter, iter_type, axis, &idx));

            /* we need to prevent these nodes from being considered in this moveto */
            if ((idx < orig_used) && (idx > i)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_NEW_CTX;
                temp_ctx = 1;
            }
        }

        if (moveto_mod && ncname && ((axis == LYXP_AXIS_DESCENDANT) || (axis == LYXP_AXIS_CHILD)) &&
                (set->val.scnodes[i].type == LYXP_NODE_ELEM) && !ly_nested_ext_schema(NULL, set->val.scnodes[i].scnode,
                moveto_mod->name, strlen(moveto_mod->name), LY_VALUE_JSON, NULL, ncname, strlen(ncname), &iter, NULL)) {
            /* there is a matching node from an extension, use it */
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, iter, LYXP_NODE_ELEM, axis, &idx));
            if ((idx < orig_used) && (idx > i)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_NEW_CTX;
                temp_ctx = 1;
            }
        }
    }

    /* correct temporary in_ctx values */
    if (temp_ctx) {
        for (i = 0; i < orig_used; ++i) {
            if (set->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_NEW_CTX) {
                set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
            }
        }
    }

    return LY_SUCCESS;
}